

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_Message_Test::TestBody
          (MessageDifferencerTest_IgnoreField_Message_Test *this)

{
  FieldDescriptor *field_00;
  allocator<char> local_369;
  string local_368;
  undefined1 local_348 [8];
  MessageDifferencer differencer;
  TestField *field;
  undefined1 local_180 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencerTest_IgnoreField_Message_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_180);
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
       (unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        )proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  proto2_unittest::TestField::set_c
            ((TestField *)
             differencer.unpack_any_field_.dynamic_message_factory_._M_t.
             super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
             .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl,3
            );
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
       (unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        )proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)local_180);
  proto2_unittest::TestField::set_c
            ((TestField *)
             differencer.unpack_any_field_.dynamic_message_factory_._M_t.
             super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
             .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl,4
            );
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"rm",&local_369);
  field_00 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_368);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)local_348,field_00);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  ExpectEqualsWithDifferencer
            ((MessageDifferencer *)local_348,(Message *)((long)&msg2.field_0 + 0xa0),
             (Message *)local_180);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_348);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_Message) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  proto2_unittest::TestField* field;

  field = msg1.add_rm();
  field->set_c(3);

  field = msg2.add_rm();
  field->set_c(4);

  util::MessageDifferencer differencer;
  differencer.IgnoreField(GetFieldDescriptor(msg1, "rm"));

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}